

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarTabListPopupButton(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ImGuiTabItem *pIVar4;
  int *in_RDI;
  char *tab_name;
  ImGuiTabItem *tab;
  int tab_n;
  ImGuiTabItem *tab_to_select;
  bool open;
  ImVec2 *in_stack_00000038;
  ImGuiSelectableFlags in_stack_00000040;
  bool in_stack_00000047;
  undefined8 in_stack_00000048;
  ImVec4 arrow_col;
  ImVec2 backup_cursor_pos;
  float tab_list_popup_button_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiComboFlags in_stack_0000013c;
  char *in_stack_00000140;
  char *in_stack_00000148;
  int in_stack_ffffffffffffff7c;
  ImGuiTabBar *in_stack_ffffffffffffff80;
  ImVec2 in_stack_ffffffffffffff88;
  ImGuiTabBar *in_stack_ffffffffffffff90;
  ImVec4 *in_stack_ffffffffffffff98;
  ImGuiCol in_stack_ffffffffffffffa4;
  int iVar5;
  ImGuiTabItem *local_58;
  ImVec4 local_4c;
  undefined8 local_3c;
  undefined4 local_34;
  float fStack_30;
  ImVec2 local_2c;
  ImVec2 local_24;
  float local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  int *local_8;
  
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_1c = GImGui->FontSize + (GImGui->Style).FramePadding.y;
  local_24 = (local_18->DC).CursorPos;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_2c,(float)in_RDI[10] - (GImGui->Style).FramePadding.y,(float)in_RDI[0xb]);
  (local_18->DC).CursorPos = local_2c;
  local_8[10] = (int)(local_1c + (float)local_8[10]);
  local_3c._0_4_ = (local_10->Style).Colors[0].x;
  local_3c._4_4_ = (local_10->Style).Colors[0].y;
  uVar1 = (local_10->Style).Colors[0].z;
  uVar2 = (local_10->Style).Colors[0].w;
  _local_34 = CONCAT44((float)uVar2 * 0.5,uVar1);
  PushStyleColor(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  ImVec4::ImVec4(&local_4c,0.0,0.0,0.0,0.0);
  PushStyleColor(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  bVar3 = BeginCombo(in_stack_00000148,in_stack_00000140,in_stack_0000013c);
  PopStyleColor((int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  local_58 = (ImGuiTabItem *)0x0;
  if (bVar3) {
    for (iVar5 = 0; iVar5 < *local_8; iVar5 = iVar5 + 1) {
      pIVar4 = ImVector<ImGuiTabItem>::operator[]
                         (&in_stack_ffffffffffffff80->Tabs,in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff80 =
           (ImGuiTabBar *)
           ImGuiTabBar::GetTabName
                     (in_stack_ffffffffffffff90,(ImGuiTabItem *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff7c = CONCAT13(local_8[5] == pIVar4->ID,(int3)in_stack_ffffffffffffff7c)
      ;
      in_stack_ffffffffffffff90 = in_stack_ffffffffffffff80;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,0.0,0.0);
      bVar3 = Selectable((char *)in_stack_00000048,in_stack_00000047,in_stack_00000040,
                         in_stack_00000038);
      if (!bVar3) {
        pIVar4 = local_58;
      }
      local_58 = pIVar4;
    }
    EndCombo();
  }
  (local_18->DC).CursorPos = local_24;
  return local_58;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarTabListPopupButton(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We use g.Style.FramePadding.y to match the square ArrowButton size
    const float tab_list_popup_button_width = g.FontSize + g.Style.FramePadding.y;
    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x - g.Style.FramePadding.y, tab_bar->BarRect.Min.y);
    tab_bar->BarRect.Min.x += tab_list_popup_button_width;

    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;
    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    bool open = BeginCombo("##v", NULL, ImGuiComboFlags_NoPreview);
    PopStyleColor(2);

    ImGuiTabItem* tab_to_select = NULL;
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            const char* tab_name = tab_bar->GetTabName(tab);
            if (Selectable(tab_name, tab_bar->SelectedTabId == tab->ID))
                tab_to_select = tab;
        }
        EndCombo();
    }

    window->DC.CursorPos = backup_cursor_pos;
    return tab_to_select;
}